

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_bench.cc
# Opt level: O2

bool track_stat(stat_history_t *stat,uint64_t lat)

{
  uint64_t local_10;
  
  if (stat != (stat_history_t *)0x0 && lat != 0xffffffff) {
    local_10 = lat;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&stat->latencies,&local_10);
  }
  return stat != (stat_history_t *)0x0 && lat != 0xffffffff;
}

Assistant:

bool track_stat(stat_history_t *stat, uint64_t lat) {

    if (lat == (uint64_t)ERR_NS) {
      return false;
    }

    if (stat) {
        stat->latencies.push_back(lat);
        return true;
    } else {
        return false;
    }
}